

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O1

void es5503_w(void *info,UINT8 offset,UINT8 data)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  ES5503Chip *chip;
  
  if (offset < 0xe0) {
    if (offset >> 5 < 7) {
      uVar3 = offset & 0x1f;
      switch(offset >> 5) {
      case '\0':
        *(UINT8 *)((long)info + (ulong)uVar3 * 0x18 + 0x38) = data;
        break;
      case '\x01':
        *(UINT8 *)((long)info + (ulong)uVar3 * 0x18 + 0x39) = data;
        return;
      case '\x02':
        *(UINT8 *)((long)info + (ulong)uVar3 * 0x18 + 0x3d) = data;
        return;
      case '\x04':
        *(uint *)((long)info + (ulong)uVar3 * 0x18 + 0x40) = (uint)data << 8;
        return;
      case '\x05':
        uVar4 = (ulong)uVar3;
        if (((data & 1) == 0) && ((*(byte *)((long)info + uVar4 * 0x18 + 0x3c) & 1) != 0)) {
          *(undefined4 *)((long)info + uVar4 * 0x18 + 0x48) = 0;
        }
        *(UINT8 *)((long)info + uVar4 * 0x18 + 0x3c) = data;
        return;
      case '\x06':
        uVar4 = (ulong)uVar3;
        uVar3 = *(uint *)((long)info + uVar4 * 0x18 + 0x40);
        uVar6 = uVar3 & 0xffff;
        if ((data & 0x40) != 0) {
          uVar6 = uVar3 | 0x10000;
        }
        *(uint *)((long)info + uVar4 * 0x18 + 0x40) = uVar6;
        bVar5 = data >> 3 & 7;
        *(byte *)((long)info + uVar4 * 0x18 + 0x44) = bVar5;
        *(UINT16 *)((long)info + uVar4 * 0x18 + 0x3a) = wavesizes[bVar5];
        *(byte *)((long)info + uVar4 * 0x18 + 0x45) = data & 7;
        return;
      }
    }
  }
  else if (offset == 0xe1) {
    bVar5 = data >> 1 & 0x1f;
    *(byte *)((long)info + 0x338) = bVar5 + 1;
    uVar2 = (ulong)(byte)(bVar5 + 3);
    uVar4 = (ulong)(*(uint *)((long)info + 0x33c) >> 3);
    uVar1 = uVar4 / uVar2;
    *(int *)((long)info + 0x344) = (int)uVar1;
    if (*(code **)((long)info + 0x348) != (code *)0x0) {
      (**(code **)((long)info + 0x348))(*(undefined8 *)((long)info + 0x350),uVar1,uVar4 % uVar2);
      return;
    }
  }
  return;
}

Assistant:

static void es5503_w(void *info, UINT8 offset, UINT8 data)
{
	ES5503Chip *chip = (ES5503Chip *)info;

	if (offset < 0xe0)
	{
		int osc = offset & 0x1f;

		switch(offset & 0xe0)
		{
			case 0:     // freq lo
				chip->oscillators[osc].freq &= 0xff00;
				chip->oscillators[osc].freq |= data;
				break;

			case 0x20:      // freq hi
				chip->oscillators[osc].freq &= 0x00ff;
				chip->oscillators[osc].freq |= (data<<8);
				break;

			case 0x40:  // volume
				chip->oscillators[osc].vol = data;
				break;

			case 0x60:  // data - ignore writes
				break;

			case 0x80:  // wavetable pointer
				chip->oscillators[osc].wavetblpointer = (data<<8);
				break;

			case 0xa0:  // oscillator control
				// key on?
				if ((chip->oscillators[osc].control & 1) && (!(data&1)))
				{
					chip->oscillators[osc].accumulator = 0;
				}
				chip->oscillators[osc].control = data;
				break;

			case 0xc0:  // bank select / wavetable size / resolution
				if (data & 0x40)    // bank select - not used on the Apple IIgs
				{
					chip->oscillators[osc].wavetblpointer |= 0x10000;
				}
				else
				{
					chip->oscillators[osc].wavetblpointer &= 0xffff;
				}

				chip->oscillators[osc].wavetblsize = ((data>>3) & 7);
				chip->oscillators[osc].wtsize = wavesizes[chip->oscillators[osc].wavetblsize];
				chip->oscillators[osc].resolution = (data & 7);
				break;
		}
	}
	else     // global registers
	{
		switch (offset)
		{
			case 0xe0:  // interrupt status
				break;

			case 0xe1:  // oscillator enable
				// The number here is the number of oscillators to enable -1 times 2.  You can never
				// have zero oscilllators enabled.  So a value of 62 enables all 32 oscillators.
				chip->oscsenabled = ((data>>1) & 0x1f) + 1;
				//notify_clock_changed();
				chip->output_rate = es5503_get_sample_rate(chip);
				if (chip->SmpRateFunc != NULL)
					chip->SmpRateFunc(chip->SmpRateData, chip->output_rate);
				break;

			case 0xe2:  // A/D converter
				break;
		}
	}
}